

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O0

int * parasail_result_get_score_table(parasail_result_t *result)

{
  int iVar1;
  parasail_result_t *result_local;
  
  if (result == (parasail_result_t *)0x0) {
    fprintf(_stderr,"%s: missing %s\n","parasail_result_get_score_table","result");
    result_local = (parasail_result_t *)0x0;
  }
  else {
    iVar1 = parasail_result_is_table(result);
    if ((iVar1 == 0) && (iVar1 = parasail_result_is_stats_table(result), iVar1 == 0)) {
      fprintf(_stderr,"%s: assert(%s) failed\n","parasail_result_get_score_table",
              "parasail_result_is_table(result) || parasail_result_is_stats_table(result)");
      return (int *)0x0;
    }
    iVar1 = parasail_result_is_stats_table(result);
    if (iVar1 == 0) {
      iVar1 = parasail_result_is_table(result);
      if (iVar1 == 0) {
        result_local = (parasail_result_t *)0x0;
      }
      else {
        result_local = (parasail_result_t *)((result->field_4).rowcols)->score_row;
      }
    }
    else {
      result_local = *((result->field_4).trace)->trace_del_table;
    }
  }
  return &result_local->score;
}

Assistant:

int* parasail_result_get_score_table(const parasail_result_t * const restrict result)
{
    PARASAIL_CHECK_NULL(result);
    PARASAIL_ASSERT(parasail_result_is_table(result) || parasail_result_is_stats_table(result));
    if (parasail_result_is_stats_table(result)) {
        return result->stats->tables->score_table;
    }
    if (parasail_result_is_table(result)) {
        return result->tables->score_table;
    }
    return NULL; /* should not reach */
}